

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

OnCallSpec<void_(int)> * __thiscall
testing::internal::FunctionMocker<void_(int)>::FindOnCallSpec
          (FunctionMocker<void_(int)> *this,ArgumentTuple *args)

{
  OnCallSpec<void_(int)> *this_00;
  bool bVar1;
  __normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
  __tmp;
  pointer ppvVar2;
  
  ppvVar2 = (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
            super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  do {
    if (ppvVar2 ==
        (this->super_UntypedFunctionMockerBase).untyped_on_call_specs_.
        super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      return (OnCallSpec<void_(int)> *)0x0;
    }
    this_00 = (OnCallSpec<void_(int)> *)ppvVar2[-1];
    ppvVar2 = ppvVar2 + -1;
    bVar1 = OnCallSpec<void_(int)>::Matches(this_00,args);
  } while (!bVar1);
  return this_00;
}

Assistant:

const OnCallSpec<F>* FindOnCallSpec(const ArgumentTuple& args) const {
    for (UntypedOnCallSpecs::const_reverse_iterator it =
             untyped_on_call_specs_.rbegin();
         it != untyped_on_call_specs_.rend(); ++it) {
      const OnCallSpec<F>* spec = static_cast<const OnCallSpec<F>*>(*it);
      if (spec->Matches(args)) return spec;
    }

    return nullptr;
  }